

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_call(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 *puVar4;
  uint temp;
  uint num_1;
  uint num;
  uint8_t high;
  int ins_len;
  
  iVar3 = get_ins_len(code_ptr[registe_ptr->IP],code_ptr[registe_ptr->IP + 1]);
  registe_ptr->SP = registe_ptr->SP + 4;
  if (code_ptr[registe_ptr->IP + 1] == '\x05') {
    uVar1 = *register_list[(byte)code_ptr[registe_ptr->IP + 2] / 0x10];
    *(uint *)(stack_ptr + registe_ptr->SP) = registe_ptr->IP + iVar3;
    registe_ptr->IP = uVar1;
  }
  else {
    if (code_ptr[registe_ptr->IP + 1] != '\x06') {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xf6;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    iVar2 = *(int *)(code_ptr + (ulong)registe_ptr->IP + 2);
    *(uint *)(stack_ptr + registe_ptr->SP) = registe_ptr->IP + iVar3;
    registe_ptr->IP = iVar2 + registe_ptr->CS;
  }
  return 1;
}

Assistant:

int do_call() {
	int ins_len;
	ins_len = get_ins_len(code_ptr[registe_ptr->IP], code_ptr[registe_ptr->IP + 1]);
	registe_ptr->SP += 4;//栈指针增加
	if (code_ptr[registe_ptr->IP + 1] == 5) {//寄存器压栈
		uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
		unsigned num = *register_list[high];
		*(unsigned*)(stack_ptr + registe_ptr->SP) = registe_ptr->IP+ins_len;//返回地址压栈
		registe_ptr->IP = num;//修改
	}
	else if (code_ptr[registe_ptr->IP + 1] == 6) {//立即数压栈
		unsigned num = *(unsigned*)(code_ptr + registe_ptr->IP + 2);
		unsigned temp = registe_ptr->IP + ins_len;
		*(unsigned*)((unsigned char*)stack_ptr + registe_ptr->SP) = temp;
		registe_ptr->IP = num + registe_ptr->CS;//修改
	}
	else throw(LVM_EXECUTE_ERROR);
	
	return LVM_SUCCESS;
}